

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

int ov_raw_seek(OggVorbis_File *vf,ogg_int64_t pos)

{
  ogg_stream_state *os;
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ogg_int64_t oVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int local_224;
  ogg_packet op;
  ogg_page og;
  ogg_stream_state work_os;
  
  iVar3 = -0x83;
  if (1 < vf->ready_state) {
    if (vf->seekable == 0) {
      iVar3 = -0x8a;
    }
    else {
      iVar3 = -0x83;
      if ((-1 < pos) && (pos <= vf->end)) {
        if (vf->ready_state != 2) {
          if ((pos < vf->offsets[vf->current_link]) ||
             (vf->offsets[(long)vf->current_link + 1] <= pos)) {
            _decode_clear(vf);
          }
        }
        vf->pcm_offset = -1;
        os = &vf->os;
        ogg_stream_reset_serialno(os,(int)vf->current_serialno);
        vorbis_synthesis_restart(&vf->vd);
        iVar3 = _seek_helper(vf,pos);
        if (iVar3 == 0) {
          ogg_stream_init(&work_os,(int)vf->current_serialno);
          ogg_stream_reset(&work_os);
          iVar3 = 0;
          local_224 = 0;
          bVar2 = false;
          uVar8 = 0;
LAB_00190246:
          uVar8 = uVar8 & 0xffffffff;
LAB_0019024c:
          iVar5 = (int)uVar8;
          if ((2 < vf->ready_state) && (iVar4 = ogg_stream_packetout(&work_os,&op), 0 < iVar4)) {
            if (vf->vi[vf->current_link].codec_setup != (void *)0x0) goto LAB_001903c6;
            ogg_stream_packetout(os,(ogg_packet *)0x0);
          }
          oVar6 = -1;
          if (iVar5 == 0) {
            oVar6 = _get_next_page(vf,&og,-1);
            if (-1 < oVar6) {
              if (vf->ready_state < 3) goto LAB_00190303;
              lVar7 = vf->current_serialno;
              iVar5 = ogg_page_serialno(&og);
              if ((lVar7 != iVar5) && (iVar5 = ogg_page_bos(&og), iVar5 != 0)) {
                _decode_clear(vf);
                ogg_stream_clear(&work_os);
              }
              if (vf->ready_state < 3) goto LAB_00190303;
              goto LAB_0019039f;
            }
            oVar6 = ov_pcm_total(vf,-1);
          }
          goto LAB_0019046d;
        }
        vf->pcm_offset = -1;
        _decode_clear(vf);
        iVar3 = -0x89;
      }
    }
  }
  return iVar3;
LAB_001903c6:
  uVar8 = vorbis_packet_blocksize(vf->vi + vf->current_link,&op);
  if ((int)uVar8 < 0) {
    uVar8 = 0;
  }
  else if ((local_224 == 0) || (bVar2)) {
    if (iVar5 != 0) {
      iVar3 = iVar3 + ((uint)(iVar5 + (int)uVar8) >> 2);
    }
    goto LAB_00190413;
  }
  ogg_stream_packetout(os,(ogg_packet *)0x0);
LAB_00190413:
  if (op.granulepos != -1) {
    uVar1 = vf->current_link;
    lVar7 = op.granulepos - vf->pcmlengths[(long)(int)uVar1 * 2];
    lVar9 = 0;
    if (lVar7 < 1) {
      lVar7 = lVar9;
    }
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (; uVar8 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
      lVar7 = lVar7 + *(long *)((long)vf->pcmlengths + lVar9 + 8);
    }
    oVar6 = 0;
    if (0 < lVar7 - iVar3) {
      oVar6 = lVar7 - iVar3;
    }
LAB_0019046d:
    vf->pcm_offset = oVar6;
    ogg_stream_clear(&work_os);
    vf->bittrack = 0.0;
    vf->samptrack = 0.0;
    return 0;
  }
  goto LAB_00190246;
LAB_00190303:
  iVar5 = ogg_page_serialno(&og);
  uVar1 = vf->links;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    if (vf->serialnos[uVar8] == (long)iVar5) {
      uVar10 = uVar8 & 0xffffffff;
      break;
    }
  }
  uVar8 = 0;
  if ((uint)uVar10 != uVar1) {
    vf->current_link = (uint)uVar10;
    vf->current_serialno = (long)iVar5;
    ogg_stream_reset_serialno(os,iVar5);
    ogg_stream_reset_serialno(&work_os,iVar5);
    vf->ready_state = 3;
    bVar2 = oVar6 <= vf->dataoffsets[uVar10];
LAB_0019039f:
    ogg_stream_pagein(os,&og);
    ogg_stream_pagein(&work_os,&og);
    local_224 = ogg_page_eos(&og);
    uVar8 = 0;
  }
  goto LAB_0019024c;
}

Assistant:

int ov_raw_seek(OggVorbis_File *vf,ogg_int64_t pos){
  ogg_stream_state work_os;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable)
    return(OV_ENOSEEK); /* don't dump machine if we can't seek */

  if(pos<0 || pos>vf->end)return(OV_EINVAL);

  /* is the seek position outside our current link [if any]? */
  if(vf->ready_state>=STREAMSET){
    if(pos<vf->offsets[vf->current_link] || pos>=vf->offsets[vf->current_link+1])
      _decode_clear(vf); /* clear out stream state */
  }

  /* don't yet clear out decoding machine (if it's initialized), in
     the case we're in the same link.  Restart the decode lapping, and
     let _fetch_and_process_packet deal with a potential bitstream
     boundary */
  vf->pcm_offset=-1;
  ogg_stream_reset_serialno(&vf->os,
                            vf->current_serialno); /* must set serialno */
  vorbis_synthesis_restart(&vf->vd);

  if(_seek_helper(vf,pos)) {
    /* dump the machine so we're in a known state */
    vf->pcm_offset=-1;
    _decode_clear(vf);
    return OV_EBADLINK;
  }

  /* we need to make sure the pcm_offset is set, but we don't want to
     advance the raw cursor past good packets just to get to the first
     with a granulepos.  That's not equivalent behavior to beginning
     decoding as immediately after the seek position as possible.

     So, a hack.  We use two stream states; a local scratch state and
     the shared vf->os stream state.  We use the local state to
     scan, and the shared state as a buffer for later decode.

     Unfortuantely, on the last page we still advance to last packet
     because the granulepos on the last page is not necessarily on a
     packet boundary, and we need to make sure the granpos is
     correct.
  */

  {
    ogg_page og;
    ogg_packet op;
    int lastblock=0;
    int accblock=0;
    int thisblock=0;
    int lastflag=0;
    int firstflag=0;
    ogg_int64_t pagepos=-1;

    ogg_stream_init(&work_os,vf->current_serialno); /* get the memory ready */
    ogg_stream_reset(&work_os); /* eliminate the spurious OV_HOLE
                                   return from not necessarily
                                   starting from the beginning */

    while(1){
      if(vf->ready_state>=STREAMSET){
        /* snarf/scan a packet if we can */
        int result=ogg_stream_packetout(&work_os,&op);

        if(result>0){

          if(vf->vi[vf->current_link].codec_setup){
            thisblock=vorbis_packet_blocksize(vf->vi+vf->current_link,&op);
            if(thisblock<0){
              ogg_stream_packetout(&vf->os,NULL);
              thisblock=0;
            }else{

              /* We can't get a guaranteed correct pcm position out of the
                 last page in a stream because it might have a 'short'
                 granpos, which can only be detected in the presence of a
                 preceding page.  However, if the last page is also the first
                 page, the granpos rules of a first page take precedence.  Not
                 only that, but for first==last, the EOS page must be treated
                 as if its a normal first page for the stream to open/play. */
              if(lastflag && !firstflag)
                ogg_stream_packetout(&vf->os,NULL);
              else
                if(lastblock)accblock+=(lastblock+thisblock)>>2;
            }

            if(op.granulepos!=-1){
              int i,link=vf->current_link;
              ogg_int64_t granulepos=op.granulepos-vf->pcmlengths[link*2];
              if(granulepos<0)granulepos=0;

              for(i=0;i<link;i++)
                granulepos+=vf->pcmlengths[i*2+1];
              vf->pcm_offset=granulepos-accblock;
              if(vf->pcm_offset<0)vf->pcm_offset=0;
              break;
            }
            lastblock=thisblock;
            continue;
          }else
            ogg_stream_packetout(&vf->os,NULL);
        }
      }

      if(!lastblock){
        pagepos=_get_next_page(vf,&og,-1);
        if(pagepos<0){
          vf->pcm_offset=ov_pcm_total(vf,-1);
          break;
        }
      }else{
        /* huh?  Bogus stream with packets but no granulepos */
        vf->pcm_offset=-1;
        break;
      }

      /* has our decoding just traversed a bitstream boundary? */
      if(vf->ready_state>=STREAMSET){
        if(vf->current_serialno!=ogg_page_serialno(&og)){

          /* two possibilities:
             1) our decoding just traversed a bitstream boundary
             2) another stream is multiplexed into this logical section? */

          if(ogg_page_bos(&og)){
            /* we traversed */
            _decode_clear(vf); /* clear out stream state */
            ogg_stream_clear(&work_os);
          } /* else, do nothing; next loop will scoop another page */
        }
      }

      if(vf->ready_state<STREAMSET){
        int link;
        long serialno = ogg_page_serialno(&og);

        for(link=0;link<vf->links;link++)
          if(vf->serialnos[link]==serialno)break;

        if(link==vf->links) continue; /* not the desired Vorbis
                                         bitstream section; keep
                                         trying */
        vf->current_link=link;
        vf->current_serialno=serialno;
        ogg_stream_reset_serialno(&vf->os,serialno);
        ogg_stream_reset_serialno(&work_os,serialno);
        vf->ready_state=STREAMSET;
        firstflag=(pagepos<=vf->dataoffsets[link]);
      }

      ogg_stream_pagein(&vf->os,&og);
      ogg_stream_pagein(&work_os,&og);
      lastflag=ogg_page_eos(&og);

    }
  }

  ogg_stream_clear(&work_os);
  vf->bittrack=0.f;
  vf->samptrack=0.f;
  return(0);
}